

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::ComputeFlagsForObject_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmTarget *target,cmGeneratorTarget *gtgt)

{
  cmMakefile *this_00;
  char *pcVar1;
  allocator local_d1;
  string includeFlags;
  string language;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = lg->Makefile;
  cmSourceFile::GetLanguage_abi_cxx11_(&language,source);
  if (language._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&language);
  }
  std::__cxx11::string::string((string *)&includeFlags,"CMAKE_BUILD_TYPE",(allocator *)&local_50);
  pcVar1 = cmMakefile::GetSafeDefinition(this_00,&includeFlags);
  std::__cxx11::string::string((string *)&local_88,pcVar1,(allocator *)&includes);
  std::__cxx11::string::~string((string *)&includeFlags);
  cmLocalGenerator::AddLanguageFlags(lg,__return_storage_ptr__,&language,&local_88);
  cmLocalGenerator::AddArchitectureFlags(lg,__return_storage_ptr__,gtgt,&language,&local_88);
  cmLocalGenerator::AddCMP0018Flags(lg,__return_storage_ptr__,target,&language,&local_88);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalGenerator::GetIncludeDirectories(lg,&includes,gtgt,&language,&local_88,true);
  std::__cxx11::string::string((string *)&local_50,"",&local_d1);
  cmLocalGenerator::GetIncludeFlags(&includeFlags,lg,&includes,gtgt,&language,true,false,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (*lg->_vptr_cmLocalGenerator[5])(lg,__return_storage_ptr__,&includeFlags);
  std::__cxx11::string::~string((string *)&includeFlags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  (*lg->_vptr_cmLocalGenerator[6])
            (lg,__return_storage_ptr__,(this_00->DefineFlags)._M_dataplus._M_p);
  cmLocalGenerator::AddCompileOptions(lg,__return_storage_ptr__,target,&language,&local_88);
  std::__cxx11::string::string((string *)&includeFlags,"COMPILE_FLAGS",(allocator *)&local_50);
  pcVar1 = cmSourceFile::GetProperty(source,&includeFlags);
  (*lg->_vptr_cmLocalGenerator[6])(lg,__return_storage_ptr__,pcVar1);
  std::__cxx11::string::~string((string *)&includeFlags);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&language);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraSublimeTextGenerator::ComputeFlagsForObject(cmSourceFile* source,
                                                   cmLocalGenerator* lg,
                                                   cmTarget *target,
                                                   cmGeneratorTarget* gtgt)
{
  std::string flags;

  cmMakefile *makefile = lg->GetMakefile();
  std::string language = source->GetLanguage();
  if (language.empty())
   {
   language = "C";
   }
  const std::string& config = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  // Add language-specific flags.
  lg->AddLanguageFlags(flags, language, config);

  lg->AddArchitectureFlags(flags, gtgt, language, config);

  // TODO: Fortran support.
  // // Fortran-specific flags computed for this target.
  // if(*l == "Fortran")
  //   {
  //   this->AddFortranFlags(flags);
  //   }

  // Add shared-library flags if needed.
  lg->AddCMP0018Flags(flags, target, language, config);

  // Add include directory flags.
  {
  std::vector<std::string> includes;
  lg->GetIncludeDirectories(includes, gtgt, language, config);
  std::string includeFlags =
    lg->GetIncludeFlags(includes, gtgt, language, true); // full include paths
  lg->AppendFlags(flags, includeFlags);
  }

  // Append old-style preprocessor definition flags.
  lg->AppendFlags(flags, makefile->GetDefineFlags());

  // Add target-specific flags.
  lg->AddCompileOptions(flags, target, language, config);

  // Add source file specific flags.
  lg->AppendFlags(flags, source->GetProperty("COMPILE_FLAGS"));

  // TODO: Handle Apple frameworks.

  return flags;
}